

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O3

int pospopcnt_u16_scalar_partition(uint16_t *data,uint32_t len,uint32_t *flags)

{
  int iVar1;
  ushort uVar2;
  bool bVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  int i;
  long lVar7;
  ulong uVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  uint32_t high [256];
  uint32_t low [256];
  int local_818 [256];
  int local_418 [256];
  
  memset(local_418,0,0x400);
  memset(local_818,0,0x400);
  if (len != 0) {
    uVar8 = 0;
    do {
      uVar2 = data[uVar8];
      uVar8 = uVar8 + 1;
      local_418[(byte)uVar2] = local_418[(byte)uVar2] + 1;
      local_818[uVar2 >> 8] = local_818[uVar2 >> 8] + 1;
    } while (len != uVar8);
  }
  auVar4 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  lVar7 = 0;
  auVar6 = *(undefined1 (*) [32])flags;
  do {
    auVar9 = vpbroadcastd_avx512vl();
    uVar8 = vptestmd_avx512vl(auVar9,auVar4);
    iVar1 = local_418[lVar7];
    auVar9._4_4_ = iVar1;
    auVar9._0_4_ = iVar1;
    auVar9._8_4_ = iVar1;
    auVar9._12_4_ = iVar1;
    auVar9._16_4_ = iVar1;
    auVar9._20_4_ = iVar1;
    auVar9._24_4_ = iVar1;
    auVar9._28_4_ = iVar1;
    auVar9 = vpaddd_avx512vl(auVar6,auVar9);
    bVar3 = (bool)((byte)uVar8 & 1);
    auVar10._0_4_ = (uint)bVar3 * auVar9._0_4_ | (uint)!bVar3 * auVar6._0_4_;
    bVar3 = (bool)((byte)(uVar8 >> 1) & 1);
    auVar10._4_4_ = (uint)bVar3 * auVar9._4_4_ | (uint)!bVar3 * auVar6._4_4_;
    bVar3 = (bool)((byte)(uVar8 >> 2) & 1);
    auVar10._8_4_ = (uint)bVar3 * auVar9._8_4_ | (uint)!bVar3 * auVar6._8_4_;
    bVar3 = (bool)((byte)(uVar8 >> 3) & 1);
    auVar10._12_4_ = (uint)bVar3 * auVar9._12_4_ | (uint)!bVar3 * auVar6._12_4_;
    bVar3 = (bool)((byte)(uVar8 >> 4) & 1);
    auVar10._16_4_ = (uint)bVar3 * auVar9._16_4_ | (uint)!bVar3 * auVar6._16_4_;
    bVar3 = (bool)((byte)(uVar8 >> 5) & 1);
    auVar10._20_4_ = (uint)bVar3 * auVar9._20_4_ | (uint)!bVar3 * auVar6._20_4_;
    bVar3 = (bool)((byte)(uVar8 >> 6) & 1);
    auVar10._24_4_ = (uint)bVar3 * auVar9._24_4_ | (uint)!bVar3 * auVar6._24_4_;
    bVar3 = SUB81(uVar8 >> 7,0);
    auVar10._28_4_ = (uint)bVar3 * auVar9._28_4_ | (uint)!bVar3 * auVar6._28_4_;
    lVar7 = lVar7 + 1;
    auVar6 = auVar10;
  } while (lVar7 != 0x100);
  *(undefined1 (*) [32])flags = auVar10;
  lVar7 = 0;
  auVar6 = *(undefined1 (*) [32])(flags + 8);
  do {
    auVar9 = vpbroadcastd_avx512vl();
    uVar8 = vptestmd_avx512vl(auVar9,auVar4);
    iVar1 = local_818[lVar7];
    auVar5._4_4_ = iVar1;
    auVar5._0_4_ = iVar1;
    auVar5._8_4_ = iVar1;
    auVar5._12_4_ = iVar1;
    auVar5._16_4_ = iVar1;
    auVar5._20_4_ = iVar1;
    auVar5._24_4_ = iVar1;
    auVar5._28_4_ = iVar1;
    auVar9 = vpaddd_avx512vl(auVar6,auVar5);
    bVar3 = (bool)((byte)uVar8 & 1);
    auVar11._0_4_ = (uint)bVar3 * auVar9._0_4_ | (uint)!bVar3 * auVar6._0_4_;
    bVar3 = (bool)((byte)(uVar8 >> 1) & 1);
    auVar11._4_4_ = (uint)bVar3 * auVar9._4_4_ | (uint)!bVar3 * auVar6._4_4_;
    bVar3 = (bool)((byte)(uVar8 >> 2) & 1);
    auVar11._8_4_ = (uint)bVar3 * auVar9._8_4_ | (uint)!bVar3 * auVar6._8_4_;
    bVar3 = (bool)((byte)(uVar8 >> 3) & 1);
    auVar11._12_4_ = (uint)bVar3 * auVar9._12_4_ | (uint)!bVar3 * auVar6._12_4_;
    bVar3 = (bool)((byte)(uVar8 >> 4) & 1);
    auVar11._16_4_ = (uint)bVar3 * auVar9._16_4_ | (uint)!bVar3 * auVar6._16_4_;
    bVar3 = (bool)((byte)(uVar8 >> 5) & 1);
    auVar11._20_4_ = (uint)bVar3 * auVar9._20_4_ | (uint)!bVar3 * auVar6._20_4_;
    bVar3 = (bool)((byte)(uVar8 >> 6) & 1);
    auVar11._24_4_ = (uint)bVar3 * auVar9._24_4_ | (uint)!bVar3 * auVar6._24_4_;
    bVar3 = SUB81(uVar8 >> 7,0);
    auVar11._28_4_ = (uint)bVar3 * auVar9._28_4_ | (uint)!bVar3 * auVar6._28_4_;
    lVar7 = lVar7 + 1;
    auVar6 = auVar11;
  } while (lVar7 != 0x100);
  *(undefined1 (*) [32])(flags + 8) = auVar11;
  return 0;
}

Assistant:

int pospopcnt_u16_scalar_partition(const uint16_t* data, uint32_t len, uint32_t* flags) {
    uint32_t low[256] = {0}, high[256] = {0};

    for (uint32_t i = 0; i < len; ++i) {
        ++low[data[i] & 255];
        ++high[(data[i] >> 8) & 255];
    }

    for (int i = 0; i < 256; ++i) {
        for (int k = 0; k < 8; ++k) {
            flags[k] += ((i & (1 << k)) >> k) * low[i];
        }
    }

    for (int i = 0; i < 256; ++i) {
        for (int k = 0; k < 8; ++k) {
            flags[k+8] += ((i & (1 << k)) >> k) * high[i];
        }
    }

    return 0;
}